

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void TypeBuilderSetArrayType
               (TypeBuilderRef builder,BinaryenIndex index,BinaryenType elementType,
               BinaryenPackedType elementPackedType,int elementMutable)

{
  Array local_18;
  
  local_18.element._8_8_ = (ulong)(elementMutable != 0) << 0x20;
  if (elementType == 2) {
    local_18.element._8_8_ = ZEXT58(CONCAT14(elementMutable != 0,elementPackedType));
  }
  else if (elementPackedType != 0) {
    __assert_fail("elementPackedType == Field::PackedType::not_packed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x18f0,
                  "void TypeBuilderSetArrayType(TypeBuilderRef, BinaryenIndex, BinaryenType, BinaryenPackedType, int)"
                 );
  }
  local_18.element.type.id = elementType;
  wasm::TypeBuilder::setHeapType(builder,(ulong)index,&local_18);
  return;
}

Assistant:

void TypeBuilderSetArrayType(TypeBuilderRef builder,
                             BinaryenIndex index,
                             BinaryenType elementType,
                             BinaryenPackedType elementPackedType,
                             int elementMutable) {
  auto* B = (TypeBuilder*)builder;
  Field element(Type(elementType),
                elementMutable ? Mutability::Mutable : Mutability::Immutable);
  if (element.type == Type::i32) {
    element.packedType = Field::PackedType(elementPackedType);
  } else {
    assert(elementPackedType == Field::PackedType::not_packed);
  }
  B->setHeapType(index, Array(element));
}